

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<test_result_(fmt::v5::monostate)> * __thiscall
testing::internal::FunctionMocker<test_result_(fmt::v5::monostate)>::With
          (FunctionMocker<test_result_(fmt::v5::monostate)> *this,Matcher<fmt::v5::monostate> *m1)

{
  MockSpec<test_result_(fmt::v5::monostate)> *pMVar1;
  FunctionMockerBase<test_result_(fmt::v5::monostate)> *in_RDI;
  ArgumentMatcherTuple *in_stack_ffffffffffffffa8;
  
  FunctionMockerBase<test_result_(fmt::v5::monostate)>::current_spec(in_RDI);
  std::tr1::make_tuple<testing::Matcher<fmt::v5::monostate>>(&in_stack_ffffffffffffffa8->f0_);
  MockSpec<test_result_(fmt::v5::monostate)>::SetMatchers
            ((MockSpec<test_result_(fmt::v5::monostate)> *)in_RDI,in_stack_ffffffffffffffa8);
  std::tr1::
  tuple<testing::Matcher<fmt::v5::monostate>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
  ::~tuple((tuple<testing::Matcher<fmt::v5::monostate>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
            *)0x18dd21);
  pMVar1 = FunctionMockerBase<test_result_(fmt::v5::monostate)>::current_spec(in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }